

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  vec<Minisat::Option_*> *this;
  string *psVar4;
  size_t sVar5;
  uint uVar6;
  char *in_RCX;
  char *extraout_RDX;
  char *in_RSI;
  Option *pOVar7;
  char *in_R8;
  int iVar8;
  Option *unaff_R14;
  Option *pOStack_38;
  StreamBuffer *pSStack_30;
  
  skipWhitespace<Minisat::StreamBuffer>(in);
  iVar3 = in->pos;
  if (iVar3 < in->size) {
    bVar1 = in->buf[iVar3];
    in_RCX = (char *)(ulong)bVar1;
    if (bVar1 == 0x2d) {
      bVar2 = true;
    }
    else {
      if (bVar1 != 0x2b) goto LAB_00106bea;
      bVar2 = false;
    }
    in->pos = iVar3 + 1;
    StreamBuffer::assureLookahead(in);
  }
  else {
LAB_00106bea:
    bVar2 = false;
  }
  iVar3 = in->pos;
  if (iVar3 < in->size) {
    pOVar7 = (Option *)(ulong)in->buf[iVar3];
    uVar6 = in->buf[iVar3] - 0x3a;
    in_RCX = (char *)(ulong)uVar6;
    if (0xf5 < (byte)uVar6) {
      iVar8 = 0;
      do {
        if (9 < (byte)(in->buf[iVar3] - 0x30)) break;
        iVar8 = (uint)in->buf[iVar3] + iVar8 * 10 + -0x30;
        in->pos = iVar3 + 1;
        StreamBuffer::assureLookahead(in);
        iVar3 = in->pos;
      } while (iVar3 < in->size);
      iVar3 = -iVar8;
      if (!bVar2) {
        iVar3 = iVar8;
      }
      return iVar3;
    }
  }
  else {
    pOVar7 = (Option *)0xffffffff;
  }
  parseInt<Minisat::StreamBuffer>();
  pOVar7->_vptr_Option = (_func_int **)&PTR__Option_00111c00;
  pOVar7->name = extraout_RDX;
  pOVar7->description = in_RCX;
  pOVar7->category = in_RSI;
  pOVar7->type_name = "<std::string>";
  pOVar7->dependOnNonDefaultOf = unaff_R14;
  pSStack_30 = in;
  this = Option::getOptionList();
  pOStack_38 = pOVar7;
  vec<Minisat::Option_*>::push(this,&pOStack_38);
  iVar3 = 0x111cf8;
  pOVar7->_vptr_Option = (_func_int **)&PTR__StringOption_00111cf8;
  if (in_R8 == (char *)0x0) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = (string *)operator_new(0x20);
    *(string **)psVar4 = psVar4 + 0x10;
    sVar5 = strlen(in_R8);
    std::__cxx11::string::_M_construct<char_const*>(psVar4,in_R8,in_R8 + sVar5);
    iVar3 = extraout_EAX;
  }
  pOVar7[1]._vptr_Option = (_func_int **)psVar4;
  pOVar7[1].name = in_R8;
  return iVar3;
}

Assistant:

static int parseInt(B &in)
{
    int val = 0;
    bool neg = false;
    skipWhitespace(in);
    if (*in == '-')
        neg = true, ++in;
    else if (*in == '+')
        ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9') val = val * 10 + (*in - '0'), ++in;
    return neg ? -val : val;
}